

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iostream-test.c++
# Opt level: O0

void __thiscall kj::std::anon_unknown_0::TestCase56::run(TestCase56 *this)

{
  int iVar1;
  size_t in_RCX;
  bool local_1da;
  char local_1d9 [6];
  char local_1d3;
  bool _kj_shouldLog;
  char buf [9];
  void *bytes;
  StdOutputStream out;
  undefined1 local_1a8 [8];
  StdInputStream in;
  stringstream ss;
  ostream local_188 [376];
  TestCase56 *local_10;
  TestCase56 *this_local;
  
  local_10 = this;
  ::std::__cxx11::stringstream::stringstream((stringstream *)&in.stream_);
  StdInputStream::StdInputStream((StdInputStream *)local_1a8,(istream *)&in.stream_);
  StdOutputStream::StdOutputStream((StdOutputStream *)&bytes,local_188);
  buf._1_8_ = anon_var_dwarf_3abda;
  StdOutputStream::write((StdOutputStream *)&bytes,0x259812,(void *)0x6,in_RCX);
  StdInputStream::tryRead((StdInputStream *)local_1a8,local_1d9,8,8);
  local_1d3 = '\0';
  iVar1 = strcmp("foobar",local_1d9);
  if (iVar1 != 0) {
    local_1da = _::Debug::shouldLog(ERROR);
    while (local_1da != false) {
      _::Debug::log<char_const(&)[46],char_const(&)[7],char(&)[9]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/std/iostream-test.c++"
                 ,0x48,ERROR,
                 "\"failed: expected \" \"::strcmp(\\\"foobar\\\", buf) == 0\", \"foobar\", buf",
                 (char (*) [46])"failed: expected ::strcmp(\"foobar\", buf) == 0",
                 (char (*) [7])"foobar",(char (*) [9])local_1d9);
      local_1da = false;
    }
  }
  StdOutputStream::~StdOutputStream((StdOutputStream *)&bytes);
  StdInputStream::~StdInputStream((StdInputStream *)local_1a8);
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&in.stream_);
  return;
}

Assistant:

TEST(StdIoStream, TryReadToEndOfFile) {
  // Check that tryRead works when eof is reached before minBytes.

  ::std::stringstream ss;

  StdInputStream in(ss);
  StdOutputStream out(ss);

  const void* bytes = "foobar";

  out.write(bytes, 6);

  char buf[9];
  in.tryRead(buf, 8, 8);
  buf[6] = '\0';

  EXPECT_STREQ("foobar", buf);
}